

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

bool __thiscall
perfetto::protos::gen::FtraceConfig::operator==(FtraceConfig *this,FtraceConfig *other)

{
  __type_conflict4 _Var1;
  bool bVar2;
  bool local_19;
  FtraceConfig *other_local;
  FtraceConfig *this_local;
  
  _Var1 = ::std::operator==(&this->unknown_fields_,&other->unknown_fields_);
  local_19 = false;
  if (_Var1) {
    bVar2 = ::std::operator==(&this->ftrace_events_,&other->ftrace_events_);
    local_19 = false;
    if (bVar2) {
      bVar2 = ::std::operator==(&this->atrace_categories_,&other->atrace_categories_);
      local_19 = false;
      if (bVar2) {
        bVar2 = ::std::operator==(&this->atrace_apps_,&other->atrace_apps_);
        local_19 = false;
        if (((bVar2) && (local_19 = false, this->buffer_size_kb_ == other->buffer_size_kb_)) &&
           (local_19 = false, this->drain_period_ms_ == other->drain_period_ms_)) {
          bVar2 = protozero::operator==(&this->compact_sched_,&other->compact_sched_);
          local_19 = false;
          if (((bVar2) &&
              (local_19 = false, (this->symbolize_ksyms_ & 1U) == (other->symbolize_ksyms_ & 1U)))
             && ((local_19 = false,
                 (this->initialize_ksyms_synchronously_for_testing_ & 1U) ==
                 (other->initialize_ksyms_synchronously_for_testing_ & 1U) &&
                 (local_19 = false,
                 (this->throttle_rss_stat_ & 1U) == (other->throttle_rss_stat_ & 1U))))) {
            local_19 = (this->disable_generic_events_ & 1U) == (other->disable_generic_events_ & 1U)
            ;
          }
        }
      }
    }
  }
  return local_19;
}

Assistant:

bool FtraceConfig::operator==(const FtraceConfig& other) const {
  return unknown_fields_ == other.unknown_fields_
   && ftrace_events_ == other.ftrace_events_
   && atrace_categories_ == other.atrace_categories_
   && atrace_apps_ == other.atrace_apps_
   && buffer_size_kb_ == other.buffer_size_kb_
   && drain_period_ms_ == other.drain_period_ms_
   && compact_sched_ == other.compact_sched_
   && symbolize_ksyms_ == other.symbolize_ksyms_
   && initialize_ksyms_synchronously_for_testing_ == other.initialize_ksyms_synchronously_for_testing_
   && throttle_rss_stat_ == other.throttle_rss_stat_
   && disable_generic_events_ == other.disable_generic_events_;
}